

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_thread.cc
# Opt level: O0

void __thiscall AckThread::SendAck(AckThread *this,WaitAckSession *session,QuickAck *ack)

{
  QuickAck *ack_local;
  WaitAckSession *session_local;
  AckThread *this_local;
  
  if (session->previous_ack_base_packet_number == -1) {
    session->previous_ack_base_packet_number = (uint)ack->base_pkt_number;
    session->previous_ack_packet_number_mask = (uint)ack->pkt_number_mask;
  }
  ack->previous_ack_base_pkt_number = (uint16_t)session->previous_ack_base_packet_number;
  ack->previous_ack_pkt_number_mask = (uint16_t)session->previous_ack_packet_number_mask;
  Send(this,&session->dst_ip,session->dst_port,ack,0xf);
  session->previous_ack_base_packet_number = (uint)ack->base_pkt_number;
  session->previous_ack_packet_number_mask = (uint)ack->pkt_number_mask;
  return;
}

Assistant:

void AckThread::SendAck(WaitAckSession* session, QuickAck& ack)
{
	if (session->previous_ack_base_packet_number == -1) {
		session->previous_ack_base_packet_number = ack.base_pkt_number;
		session->previous_ack_packet_number_mask = ack.pkt_number_mask;
	}
	ack.previous_ack_base_pkt_number = session->previous_ack_base_packet_number;
	ack.previous_ack_pkt_number_mask = session->previous_ack_packet_number_mask;
	Send(session->dst_ip, session->dst_port, &ack, sizeof(ack));
	session->previous_ack_base_packet_number = ack.base_pkt_number;
	session->previous_ack_packet_number_mask = ack.pkt_number_mask;
}